

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O3

_Bool trans_VSEL(DisasContext_conflict1 *s,arg_VSEL *a)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var5;
  TCGTemp *pTVar6;
  TCGv_i64 v1;
  TCGTemp *pTVar7;
  TCGv_i64 v2;
  TCGTemp *pTVar8;
  TCGv_i64 ret;
  TCGTemp *pTVar9;
  TCGTemp *a2;
  TCGv_i32 v1_00;
  TCGv_i64 pTVar10;
  TCGv_i32 pTVar11;
  uintptr_t o_1;
  TCGv_i64 ret_00;
  TCGCond TVar12;
  TCGv_i64 c1;
  TCGv_i32 c1_00;
  TCGv_i32 v2_00;
  uintptr_t o_4;
  TCGv_i64 local_90;
  TCGv_i32 local_80;
  
  if ((s->isar->mvfr2 & 0xf0) == 0) {
    return false;
  }
  tcg_ctx = s->uc->tcg_ctx;
  iVar1 = a->dp;
  if (iVar1 != 0) {
    uVar2 = s->isar->mvfr0;
    if ((uVar2 & 0xf00) == 0) {
      return false;
    }
    if (((uVar2 & 0xe) == 0) && (((a->vn | a->vm | a->vd) & 0x10U) != 0)) {
      return false;
    }
  }
  uVar2 = a->vd;
  uVar3 = a->vm;
  uVar4 = a->vn;
  _Var5 = full_vfp_access_check(s,false);
  if (!_Var5) {
    return true;
  }
  if (iVar1 == 0) {
    local_90 = (TCGv_i64)tcg_const_i32_aarch64(tcg_ctx,0);
    pTVar6 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
    v1_00 = (TCGv_i32)((long)pTVar6 - (long)tcg_ctx);
    pTVar7 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
    v2_00 = (TCGv_i32)((long)pTVar7 - (long)tcg_ctx);
    pTVar8 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
    local_80 = (TCGv_i32)((long)pTVar8 - (long)tcg_ctx);
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_ld_i32,(TCGArg)pTVar6,
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                        ((ulong)(uVar4 * 4 & 4) | (ulong)(uVar4 * 4 & 8) | (ulong)(uVar4 >> 2) << 8)
                        + 0xc10);
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_ld_i32,(TCGArg)pTVar7,
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                        ((ulong)(uVar3 * 4 & 4) | (ulong)(uVar3 * 4 & 8) | (ulong)(uVar3 >> 2) << 8)
                        + 0xc10);
    switch(a->cc) {
    case 0:
      pTVar11 = tcg_ctx->cpu_ZF;
      TVar12 = TCG_COND_EQ;
      break;
    case 1:
      pTVar11 = tcg_ctx->cpu_VF;
      TVar12 = TCG_COND_LT;
      break;
    case 2:
      pTVar6 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
      c1_00 = (TCGv_i32)((long)pTVar6 - (long)tcg_ctx);
      tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_xor_i32,(TCGArg)pTVar6,
                          (TCGArg)(tcg_ctx->cpu_VF + (long)tcg_ctx),
                          (TCGArg)(tcg_ctx->cpu_NF + (long)tcg_ctx));
      pTVar11 = v1_00;
      goto LAB_00651205;
    case 3:
      tcg_gen_movcond_i32_aarch64
                (tcg_ctx,TCG_COND_NE,local_80,tcg_ctx->cpu_ZF,(TCGv_i32)local_90,v1_00,v2_00);
      pTVar6 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
      c1_00 = (TCGv_i32)((long)pTVar6 - (long)tcg_ctx);
      tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_xor_i32,(TCGArg)pTVar6,
                          (TCGArg)(tcg_ctx->cpu_VF + (long)tcg_ctx),
                          (TCGArg)(tcg_ctx->cpu_NF + (long)tcg_ctx));
      pTVar11 = local_80;
LAB_00651205:
      tcg_gen_movcond_i32_aarch64
                (tcg_ctx,TCG_COND_GE,local_80,c1_00,(TCGv_i32)local_90,pTVar11,v2_00);
      tcg_temp_free_internal_aarch64(tcg_ctx,pTVar6);
    default:
      goto switchD_00650f86_default;
    }
    tcg_gen_movcond_i32_aarch64(tcg_ctx,TVar12,local_80,pTVar11,(TCGv_i32)local_90,v1_00,v2_00);
switchD_00650f86_default:
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_st_i32,(TCGArg)pTVar8,
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                        (ulong)(uVar2 * 4 & 4) + ((ulong)(uVar2 * 4 & 8) | (ulong)(uVar2 >> 2) << 8)
                        + 0xc10);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(v1_00 + (long)tcg_ctx));
    goto LAB_006512a0;
  }
  local_90 = tcg_const_i64_aarch64(tcg_ctx,0);
  pTVar6 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
  v1 = (TCGv_i64)((long)pTVar6 - (long)tcg_ctx);
  pTVar7 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
  v2 = (TCGv_i64)((long)pTVar7 - (long)tcg_ctx);
  pTVar8 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar8 - (long)tcg_ctx);
  pTVar9 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
  ret_00 = (TCGv_i64)((long)pTVar9 - (long)tcg_ctx);
  pTVar9 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
  v2_00 = (TCGv_i32)((long)pTVar9 - (long)tcg_ctx);
  a2 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
  local_80 = (TCGv_i32)((long)a2 - (long)tcg_ctx);
  tcg_gen_extu_i32_i64_aarch64(tcg_ctx,ret_00,tcg_ctx->cpu_ZF);
  tcg_gen_ext_i32_i64_aarch64(tcg_ctx,(TCGv_i64)v2_00,tcg_ctx->cpu_NF);
  tcg_gen_ext_i32_i64_aarch64(tcg_ctx,(TCGv_i64)local_80,tcg_ctx->cpu_VF);
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_ld_i64,(TCGArg)pTVar6,
                      (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                      (ulong)(uVar4 >> 1) * 0x100 + (ulong)(uVar4 & 1) * 8 + 0xc10);
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_ld_i64,(TCGArg)pTVar7,
                      (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                      (ulong)(uVar3 >> 1) * 0x100 + (ulong)(uVar3 & 1) * 8 + 0xc10);
  switch(a->cc) {
  case 0:
    TVar12 = TCG_COND_EQ;
    pTVar10 = ret_00;
    break;
  case 1:
    TVar12 = TCG_COND_LT;
    pTVar10 = (TCGv_i64)local_80;
    break;
  case 2:
    pTVar6 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    c1 = (TCGv_i64)((long)pTVar6 - (long)tcg_ctx);
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_xor_i64,(TCGArg)pTVar6,(TCGArg)a2,(TCGArg)pTVar9);
    pTVar10 = v1;
    goto LAB_0065106f;
  case 3:
    tcg_gen_movcond_i64_aarch64(tcg_ctx,TCG_COND_NE,ret,ret_00,local_90,v1,v2);
    pTVar6 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    c1 = (TCGv_i64)((long)pTVar6 - (long)tcg_ctx);
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_xor_i64,(TCGArg)pTVar6,(TCGArg)a2,(TCGArg)pTVar9);
    pTVar10 = ret;
LAB_0065106f:
    tcg_gen_movcond_i64_aarch64(tcg_ctx,TCG_COND_GE,ret,c1,local_90,pTVar10,v2);
    tcg_temp_free_internal_aarch64(tcg_ctx,pTVar6);
  default:
    goto switchD_00650e67_default;
  }
  tcg_gen_movcond_i64_aarch64(tcg_ctx,TVar12,ret,pTVar10,local_90,v1,v2);
switchD_00650e67_default:
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_st_i64,(TCGArg)pTVar8,
                      (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                      (ulong)(uVar2 >> 1) * 0x100 + (ulong)(uVar2 & 1) * 8 + 0xc10);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(v1 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(v2 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
LAB_006512a0:
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(v2_00 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(local_80 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(local_90 + (long)tcg_ctx));
  return true;
}

Assistant:

static bool trans_VSEL(DisasContext *s, arg_VSEL *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t rd, rn, rm;
    bool dp = a->dp;

    if (!dc_isar_feature(aa32_vsel, s)) {
        return false;
    }

    if (dp && !dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist */
    if (dp && !dc_isar_feature(aa32_simd_r32, s) &&
        ((a->vm | a->vn | a->vd) & 0x10)) {
        return false;
    }

    rd = a->vd;
    rn = a->vn;
    rm = a->vm;

    if (!vfp_access_check(s)) {
        return true;
    }

    if (dp) {
        TCGv_i64 frn, frm, dest;
        TCGv_i64 tmp, zero, zf, nf, vf;

        zero = tcg_const_i64(tcg_ctx, 0);

        frn = tcg_temp_new_i64(tcg_ctx);
        frm = tcg_temp_new_i64(tcg_ctx);
        dest = tcg_temp_new_i64(tcg_ctx);

        zf = tcg_temp_new_i64(tcg_ctx);
        nf = tcg_temp_new_i64(tcg_ctx);
        vf = tcg_temp_new_i64(tcg_ctx);

        tcg_gen_extu_i32_i64(tcg_ctx, zf, tcg_ctx->cpu_ZF);
        tcg_gen_ext_i32_i64(tcg_ctx, nf, tcg_ctx->cpu_NF);
        tcg_gen_ext_i32_i64(tcg_ctx, vf, tcg_ctx->cpu_VF);

        neon_load_reg64(tcg_ctx, frn, rn);
        neon_load_reg64(tcg_ctx, frm, rm);
        switch (a->cc) {
        case 0: /* eq: Z */
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, dest, zf, zero,
                                frn, frm);
            break;
        case 1: /* vs: V */
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_LT, dest, vf, zero,
                                frn, frm);
            break;
        case 2: /* ge: N == V -> N ^ V == 0 */
            tmp = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_xor_i64(tcg_ctx, tmp, vf, nf);
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_GE, dest, tmp, zero,
                                frn, frm);
            tcg_temp_free_i64(tcg_ctx, tmp);
            break;
        case 3: /* gt: !Z && N == V */
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_NE, dest, zf, zero,
                                frn, frm);
            tmp = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_xor_i64(tcg_ctx, tmp, vf, nf);
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_GE, dest, tmp, zero,
                                dest, frm);
            tcg_temp_free_i64(tcg_ctx, tmp);
            break;
        }
        neon_store_reg64(tcg_ctx, dest, rd);
        tcg_temp_free_i64(tcg_ctx, frn);
        tcg_temp_free_i64(tcg_ctx, frm);
        tcg_temp_free_i64(tcg_ctx, dest);  // qq

        tcg_temp_free_i64(tcg_ctx, zf);
        tcg_temp_free_i64(tcg_ctx, nf);
        tcg_temp_free_i64(tcg_ctx, vf);

        tcg_temp_free_i64(tcg_ctx, zero);
    } else {
        TCGv_i32 frn, frm, dest;
        TCGv_i32 tmp, zero;

        zero = tcg_const_i32(tcg_ctx, 0);

        frn = tcg_temp_new_i32(tcg_ctx);
        frm = tcg_temp_new_i32(tcg_ctx);
        dest = tcg_temp_new_i32(tcg_ctx);
        neon_load_reg32(tcg_ctx, frn, rn);
        neon_load_reg32(tcg_ctx, frm, rm);
        switch (a->cc) {
        case 0: /* eq: Z */
            tcg_gen_movcond_i32(tcg_ctx, TCG_COND_EQ, dest, tcg_ctx->cpu_ZF, zero,
                                frn, frm);
            break;
        case 1: /* vs: V */
            tcg_gen_movcond_i32(tcg_ctx, TCG_COND_LT, dest, tcg_ctx->cpu_VF, zero,
                                frn, frm);
            break;
        case 2: /* ge: N == V -> N ^ V == 0 */
            tmp = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_xor_i32(tcg_ctx, tmp, tcg_ctx->cpu_VF, tcg_ctx->cpu_NF);
            tcg_gen_movcond_i32(tcg_ctx, TCG_COND_GE, dest, tmp, zero,
                                frn, frm);
            tcg_temp_free_i32(tcg_ctx, tmp);
            break;
        case 3: /* gt: !Z && N == V */
            tcg_gen_movcond_i32(tcg_ctx, TCG_COND_NE, dest, tcg_ctx->cpu_ZF, zero,
                                frn, frm);
            tmp = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_xor_i32(tcg_ctx, tmp, tcg_ctx->cpu_VF, tcg_ctx->cpu_NF);
            tcg_gen_movcond_i32(tcg_ctx, TCG_COND_GE, dest, tmp, zero,
                                dest, frm);
            tcg_temp_free_i32(tcg_ctx, tmp);
            break;
        }
        neon_store_reg32(tcg_ctx, dest, rd);
        tcg_temp_free_i32(tcg_ctx, frn);
        tcg_temp_free_i32(tcg_ctx, frm);
        tcg_temp_free_i32(tcg_ctx, dest);

        tcg_temp_free_i32(tcg_ctx, zero);
    }

    return true;
}